

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

void futime_cb(uv_fs_t *req)

{
  undefined8 uVar1;
  char *pcVar2;
  
  if (req == &futime_req) {
    if (futime_req.result == 0) {
      if (futime_req.fs_type == UV_FS_FUTIME) {
        check_utime(*futime_req.data,*(double *)((long)futime_req.data + 8),
                    *(double *)((long)futime_req.data + 0x10));
        uv_fs_req_cleanup(&futime_req);
        futime_cb_count = futime_cb_count + 1;
        return;
      }
      pcVar2 = "req->fs_type == UV_FS_FUTIME";
      uVar1 = 0x34f;
    }
    else {
      pcVar2 = "req->result == 0";
      uVar1 = 0x34e;
    }
  }
  else {
    pcVar2 = "req == &futime_req";
    uVar1 = 0x34d;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
          ,uVar1,pcVar2);
  abort();
}

Assistant:

static void futime_cb(uv_fs_t* req) {
  utime_check_t* c;

  ASSERT(req == &futime_req);
  ASSERT(req->result == 0);
  ASSERT(req->fs_type == UV_FS_FUTIME);

  c = req->data;
  check_utime(c->path, c->atime, c->mtime);

  uv_fs_req_cleanup(req);
  futime_cb_count++;
}